

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::SpillInlineeArgs(LinearScan *this,Instr *instr)

{
  RealCount *pRVar1;
  RegNum RVar2;
  uint uVar3;
  LoweredBasicBlock *pLVar4;
  Lifetime *spilledRange;
  StackSym *sym;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  Func **ppFVar9;
  Type pSVar10;
  long lVar11;
  ulong local_40;
  
  if ((this->currentBlock->inlineeStack).
      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xd4c,"(this->currentBlock->inlineeStack.Count() > 0)",
                       "this->currentBlock->inlineeStack.Count() > 0");
    if (!bVar6) {
LAB_0058ca9d:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  ppFVar9 = JsUtil::
            List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
            Last(&this->currentBlock->inlineeStack);
  instr->m_func = *ppFVar9;
  pLVar4 = this->currentBlock;
  if (0 < (pLVar4->inlineeFrameLifetimes).
          super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_40 = 0;
    lVar11 = 0;
    do {
      spilledRange = (pLVar4->inlineeFrameLifetimes).
                     super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                     buffer[lVar11];
      uVar3 = spilledRange->start;
      uVar7 = IR::Instr::GetNumber(instr);
      if (uVar3 < uVar7) {
        uVar3 = spilledRange->end;
        uVar7 = IR::Instr::GetNumber(instr);
        if (uVar3 < uVar7) goto LAB_0058c7f1;
      }
      else {
LAB_0058c7f1:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd54,
                           "(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber())"
                           ,
                           "lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber()"
                          );
        if (!bVar6) goto LAB_0058ca9d;
        *puVar8 = 0;
      }
      bVar6 = StackSym::IsConst(spilledRange->sym);
      if (bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd55,"(!lifetime->sym->IsConst())","!lifetime->sym->IsConst()");
        if (!bVar6) goto LAB_0058ca9d;
        *puVar8 = 0;
      }
      bVar6 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&this->currentBlock->inlineeFrameSyms,
                            &(spilledRange->sym->super_Sym).m_id);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd56,
                           "(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id))"
                           ,"this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id)")
        ;
        if (!bVar6) goto LAB_0058ca9d;
        *puVar8 = 0;
      }
      RVar2 = spilledRange->reg;
      if (((RVar2 != RegNOREG) && ((spilledRange->field_0x9c & 0x19) == 0)) &&
         ((sym = spilledRange->sym, (sym->field_0x18 & 1) != 0 ||
          ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
           (spilledRange->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList)))) {
        BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
        if ((local_40 >> ((ulong)RVar2 & 0x3f) & 1) == 0) {
          RVar2 = spilledRange->reg;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
          if ((sym->field_0x19 & 0x10) == 0) {
            AllocateStackSpace(this,spilledRange);
          }
          RecordLoopUse(this,spilledRange,spilledRange->reg);
          if (this->regContent[spilledRange->reg] == (Lifetime *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0xd69,"(this->regContent[lifetime->reg] != nullptr)",
                               "this->regContent[lifetime->reg] != nullptr");
            if (!bVar6) goto LAB_0058ca9d;
            *puVar8 = 0;
          }
          if ((sym->field_0x18 & 1) != 0) {
            if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                (spilledRange->defList).
                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0xd6e,"(lifetime->defList.Empty())","lifetime->defList.Empty()");
              if (!bVar6) goto LAB_0058ca9d;
              *puVar8 = 0;
            }
            pSVar10 = (Type)new<Memory::ArenaAllocator>
                                      (0x10,(spilledRange->defList).allocator,0x366bee);
            *(anon_union_8_2_fd66ddfd_for_StackSym_35 *)(pSVar10 + 1) = sym->field_5;
            pSVar10->next =
                 (spilledRange->defList).
                 super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
            (spilledRange->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
            pRVar1 = &(spilledRange->defList).
                      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
          local_40 = local_40 | 1L << ((ulong)RVar2 & 0x3f);
          InsertStore(this,instr->m_prev,sym,spilledRange->reg);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pLVar4->inlineeFrameLifetimes).
                      super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                      count);
  }
  return;
}

Assistant:

void LinearScan::SpillInlineeArgs(IR::Instr* instr)
{
    Assert(this->currentBlock->inlineeStack.Count() > 0);

    // Ensure the call instruction is tied to the current inlinee
    // This is used in the encoder to encode mapping or return offset and InlineeFrameRecord
    instr->m_func = this->currentBlock->inlineeStack.Last();

    BitVector spilledRegs;
    this->currentBlock->inlineeFrameLifetimes.Map([&](uint i, Lifetime* lifetime){
        Assert(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber());
        Assert(!lifetime->sym->IsConst());
        Assert(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id));
        if (lifetime->reg == RegNOREG)
        {
            return;
        }

        StackSym* sym = lifetime->sym;
        if (!lifetime->isSpilled && !lifetime->isOpHelperSpilled &&
            (!lifetime->isDeadStore && (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))) // if deflist is empty - we have already spilled at all defs - and the value is current
        {
            if (!spilledRegs.Test(lifetime->reg))
            {
                spilledRegs.Set(lifetime->reg);
                if (!sym->IsAllocated())
                {
                    this->AllocateStackSpace(lifetime);
                }

                this->RecordLoopUse(lifetime, lifetime->reg);
                Assert(this->regContent[lifetime->reg] != nullptr);
                if (sym->m_isSingleDef)
                {
                    // For a single def - we do not track the deflist - the def below will remove the single def on the sym
                    // hence, we need to track the original def.
                    Assert(lifetime->defList.Empty());
                    lifetime->defList.Prepend(sym->m_instrDef);
                }

                this->InsertStore(instr->m_prev, sym, lifetime->reg);
            }
        }
    });
}